

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-test.cc
# Opt level: O0

void __thiscall FormatterTest_NamedArg_Test::TestBody(FormatterTest_NamedArg_Test *this)

{
  string_view name;
  string_view name_00;
  string_view name_01;
  string_view name_02;
  string_view name_03;
  string_view name_04;
  string_view name_05;
  string_view name_06;
  string_view name_07;
  string_view name_08;
  string_view name_09;
  string_view name_10;
  string_view name_11;
  string_view name_12;
  string_view name_13;
  string_view name_14;
  string_view name_15;
  string_view name_16;
  string_view name_17;
  string_view name_18;
  string_view name_19;
  string_view name_20;
  bool bVar1;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  format_error *e;
  bool gtest_caught_expected;
  string gtest_expected_message;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  char *in_stack_fffffffffffff558;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff560;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *actual;
  char (*in_stack_fffffffffffff568) [6];
  AssertHelper *expected;
  char (*in_stack_fffffffffffff570) [2];
  Message *actual_expression;
  undefined4 in_stack_fffffffffffff578;
  int in_stack_fffffffffffff57c;
  char *expected_expression;
  char *in_stack_fffffffffffff580;
  char *file;
  char (*in_stack_fffffffffffff588) [95];
  Type TVar2;
  AssertionResult *in_stack_fffffffffffff590;
  AssertHelper *this_00;
  char (*in_stack_fffffffffffff598) [4];
  named_arg<int,_char> *in_stack_fffffffffffff5a8;
  named_arg<int,_char> *in_stack_fffffffffffff5b0;
  named_arg<char[2],_char> *in_stack_fffffffffffff5b8;
  named_arg<char,_char> *in_stack_fffffffffffff5c0;
  undefined7 in_stack_fffffffffffff5c8;
  undefined1 in_stack_fffffffffffff5cf;
  Message *in_stack_fffffffffffff5d8;
  Message *message;
  AssertHelper *in_stack_fffffffffffff5e0;
  AssertHelper *this_01;
  named_arg<int,_char> *in_stack_fffffffffffff828;
  named_arg<int,_char> *in_stack_fffffffffffff830;
  named_arg<int,_char> *in_stack_fffffffffffff838;
  named_arg<int,_char> *in_stack_fffffffffffff840;
  char (*in_stack_fffffffffffff848) [4];
  AssertHelper local_788 [3];
  named_arg<int,_char> *in_stack_fffffffffffff890;
  named_arg<int,_char> *in_stack_fffffffffffff898;
  named_arg<int,_char> *in_stack_fffffffffffff8a0;
  named_arg<int,_char> *in_stack_fffffffffffff8a8;
  undefined4 in_stack_fffffffffffff8b0;
  undefined4 uVar3;
  named_arg<int,_char> *in_stack_fffffffffffff8b8;
  named_arg<int,_char> *in_stack_fffffffffffff8c0;
  named_arg<int,_char> *in_stack_fffffffffffff8c8;
  named_arg<int,_char> *in_stack_fffffffffffff8d0;
  named_arg<int,_char> *in_stack_fffffffffffff8d8;
  named_arg<int,_char> *in_stack_fffffffffffff8e0;
  named_arg<int,_char> *in_stack_fffffffffffff8e8;
  char local_6e8 [60];
  undefined4 local_6ac;
  char local_698 [60];
  undefined4 local_65c;
  Message local_648 [7];
  undefined4 local_60c;
  AssertHelper local_5f8 [7];
  undefined4 local_5bc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5a8;
  undefined4 local_56c;
  undefined4 local_51c;
  undefined4 local_4cc;
  undefined4 local_47c;
  undefined4 local_42c;
  string local_3e0 [32];
  AssertionResult local_3c0 [2];
  undefined4 local_39c;
  undefined4 local_34c;
  string local_348 [32];
  AssertionResult local_328 [2];
  undefined4 local_304;
  string local_2b8 [32];
  AssertionResult local_298 [2];
  undefined4 local_274;
  undefined4 local_224;
  string local_220 [32];
  AssertionResult local_200 [3];
  int local_1cc;
  string local_1c8 [38];
  byte local_1a2;
  allocator local_1a1;
  string local_1a0 [32];
  AssertionResult local_180 [3];
  undefined4 local_14c;
  undefined1 local_b1;
  string local_68 [32];
  AssertionResult local_48;
  
  fmt::v5::basic_string_view<char>::basic_string_view
            ((basic_string_view<char> *)in_stack_fffffffffffff560,in_stack_fffffffffffff558);
  local_b1 = 0x61;
  name.data_._4_4_ = in_stack_fffffffffffff57c;
  name.data_._0_4_ = in_stack_fffffffffffff578;
  name.size_ = (size_t)in_stack_fffffffffffff580;
  fmt::v5::arg<char>(name,*in_stack_fffffffffffff570);
  fmt::v5::basic_string_view<char>::basic_string_view
            ((basic_string_view<char> *)in_stack_fffffffffffff560,in_stack_fffffffffffff558);
  name_00.data_._4_4_ = in_stack_fffffffffffff57c;
  name_00.data_._0_4_ = in_stack_fffffffffffff578;
  name_00.size_ = (size_t)in_stack_fffffffffffff580;
  fmt::v5::arg<char[2]>(name_00,in_stack_fffffffffffff570);
  fmt::v5::basic_string_view<char>::basic_string_view
            ((basic_string_view<char> *)in_stack_fffffffffffff560,in_stack_fffffffffffff558);
  local_14c = 1;
  name_01.data_._4_4_ = in_stack_fffffffffffff57c;
  name_01.data_._0_4_ = in_stack_fffffffffffff578;
  name_01.size_ = (size_t)in_stack_fffffffffffff580;
  fmt::v5::arg<int>(name_01,(int *)in_stack_fffffffffffff570);
  fmt::v5::
  format<char[15],fmt::v5::internal::named_arg<char,char>,fmt::v5::internal::named_arg<char[2],char>,fmt::v5::internal::named_arg<int,char>>
            ((char (*) [15])CONCAT17(in_stack_fffffffffffff5cf,in_stack_fffffffffffff5c8),
             in_stack_fffffffffffff5c0,in_stack_fffffffffffff5b8,in_stack_fffffffffffff5b0);
  testing::internal::EqHelper<false>::Compare<char[6],std::__cxx11::string>
            ((char *)CONCAT44(in_stack_fffffffffffff57c,in_stack_fffffffffffff578),
             *in_stack_fffffffffffff570,in_stack_fffffffffffff568,in_stack_fffffffffffff560);
  std::__cxx11::string::~string(local_68);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_48);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff590);
    testing::AssertionResult::failure_message((AssertionResult *)0x1334de);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff590,
               (Type)((ulong)in_stack_fffffffffffff588 >> 0x20),in_stack_fffffffffffff580,
               in_stack_fffffffffffff57c,*in_stack_fffffffffffff570);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff5e0,in_stack_fffffffffffff5d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff560);
    testing::Message::~Message((Message *)0x133541);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x133599);
  testing::AssertionSuccess();
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_180);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1a0,"argument not found",&local_1a1);
    std::allocator<char>::~allocator((allocator<char> *)&local_1a1);
    local_1a2 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      fmt::v5::format<char[4]>(in_stack_fffffffffffff598);
      std::__cxx11::string::~string(local_1c8);
    }
    if ((local_1a2 & 1) == 0) {
      testing::AssertionResult::operator<<(in_stack_fffffffffffff590,in_stack_fffffffffffff588);
      local_1cc = 2;
    }
    else {
      local_1cc = 0;
    }
    std::__cxx11::string::~string(local_1a0);
    TVar2 = (Type)((ulong)in_stack_fffffffffffff588 >> 0x20);
    if (local_1cc == 0) goto LAB_001339f6;
  }
  TVar2 = (Type)((ulong)in_stack_fffffffffffff588 >> 0x20);
  testing::Message::Message((Message *)in_stack_fffffffffffff590);
  testing::AssertionResult::failure_message((AssertionResult *)0x133948);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)in_stack_fffffffffffff590,TVar2,in_stack_fffffffffffff580,
             in_stack_fffffffffffff57c,*in_stack_fffffffffffff570);
  testing::internal::AssertHelper::operator=(in_stack_fffffffffffff5e0,in_stack_fffffffffffff5d8);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff560);
  testing::Message::~Message((Message *)0x1339ab);
LAB_001339f6:
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x133a03);
  local_224 = 0xffffffd6;
  fmt::v5::basic_string_view<char>::basic_string_view
            ((basic_string_view<char> *)in_stack_fffffffffffff560,in_stack_fffffffffffff558);
  local_274 = 4;
  name_02.data_._4_4_ = in_stack_fffffffffffff57c;
  name_02.data_._0_4_ = in_stack_fffffffffffff578;
  name_02.size_ = (size_t)in_stack_fffffffffffff580;
  fmt::v5::arg<int>(name_02,(int *)in_stack_fffffffffffff570);
  fmt::v5::format<char[12],int,fmt::v5::internal::named_arg<int,char>>
            ((char (*) [12])in_stack_fffffffffffff5b8,(int *)in_stack_fffffffffffff5b0,
             in_stack_fffffffffffff5a8);
  testing::internal::EqHelper<false>::Compare<char[5],std::__cxx11::string>
            ((char *)CONCAT44(in_stack_fffffffffffff57c,in_stack_fffffffffffff578),
             *in_stack_fffffffffffff570,(char (*) [5])in_stack_fffffffffffff568,
             in_stack_fffffffffffff560);
  std::__cxx11::string::~string(local_220);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_200);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff590);
    testing::AssertionResult::failure_message((AssertionResult *)0x133b54);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff590,TVar2,in_stack_fffffffffffff580,
               in_stack_fffffffffffff57c,*in_stack_fffffffffffff570);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff5e0,in_stack_fffffffffffff5d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff560);
    testing::Message::~Message((Message *)0x133bb7);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x133c0f);
  fmt::v5::basic_string_view<char>::basic_string_view
            ((basic_string_view<char> *)in_stack_fffffffffffff560,in_stack_fffffffffffff558);
  local_304 = 2;
  name_03.data_._4_4_ = in_stack_fffffffffffff57c;
  name_03.data_._0_4_ = in_stack_fffffffffffff578;
  name_03.size_ = (size_t)in_stack_fffffffffffff580;
  fmt::v5::arg<int>(name_03,(int *)in_stack_fffffffffffff570);
  fmt::v5::format<char[17],char[4],fmt::v5::internal::named_arg<int,char>>
            ((char (*) [17])in_stack_fffffffffffff5b8,(char (*) [4])in_stack_fffffffffffff5b0,
             in_stack_fffffffffffff5a8);
  testing::internal::EqHelper<false>::Compare<char[3],std::__cxx11::string>
            ((char *)CONCAT44(in_stack_fffffffffffff57c,in_stack_fffffffffffff578),
             *in_stack_fffffffffffff570,(char (*) [3])in_stack_fffffffffffff568,
             in_stack_fffffffffffff560);
  std::__cxx11::string::~string(local_2b8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_298);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff590);
    testing::AssertionResult::failure_message((AssertionResult *)0x133d54);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff590,TVar2,in_stack_fffffffffffff580,
               in_stack_fffffffffffff57c,*in_stack_fffffffffffff570);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff5e0,in_stack_fffffffffffff5d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff560);
    testing::Message::~Message((Message *)0x133db7);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x133e0f);
  local_34c = 1;
  fmt::v5::basic_string_view<char>::basic_string_view
            ((basic_string_view<char> *)in_stack_fffffffffffff560,in_stack_fffffffffffff558);
  local_39c = 2;
  name_04.data_._4_4_ = in_stack_fffffffffffff57c;
  name_04.data_._0_4_ = in_stack_fffffffffffff578;
  name_04.size_ = (size_t)in_stack_fffffffffffff580;
  fmt::v5::arg<int>(name_04,(int *)in_stack_fffffffffffff570);
  fmt::v5::format<char[9],int,fmt::v5::internal::named_arg<int,char>>
            ((char (*) [9])in_stack_fffffffffffff5b8,(int *)in_stack_fffffffffffff5b0,
             in_stack_fffffffffffff5a8);
  testing::internal::EqHelper<false>::Compare<char[4],std::__cxx11::string>
            ((char *)CONCAT44(in_stack_fffffffffffff57c,in_stack_fffffffffffff578),
             *in_stack_fffffffffffff570,(char (*) [4])in_stack_fffffffffffff568,
             in_stack_fffffffffffff560);
  std::__cxx11::string::~string(local_348);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_328);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff590);
    testing::AssertionResult::failure_message((AssertionResult *)0x133f60);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff590,TVar2,in_stack_fffffffffffff580,
               in_stack_fffffffffffff57c,*in_stack_fffffffffffff570);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff5e0,in_stack_fffffffffffff5d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff560);
    testing::Message::~Message((Message *)0x133fc3);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x13401b);
  fmt::v5::basic_string_view<char>::basic_string_view
            ((basic_string_view<char> *)in_stack_fffffffffffff560,in_stack_fffffffffffff558);
  local_42c = 0;
  name_05.data_._4_4_ = in_stack_fffffffffffff57c;
  name_05.data_._0_4_ = in_stack_fffffffffffff578;
  name_05.size_ = (size_t)in_stack_fffffffffffff580;
  fmt::v5::arg<int>(name_05,(int *)in_stack_fffffffffffff570);
  fmt::v5::basic_string_view<char>::basic_string_view
            ((basic_string_view<char> *)in_stack_fffffffffffff560,in_stack_fffffffffffff558);
  local_47c = 0;
  name_06.data_._4_4_ = in_stack_fffffffffffff57c;
  name_06.data_._0_4_ = in_stack_fffffffffffff578;
  name_06.size_ = (size_t)in_stack_fffffffffffff580;
  fmt::v5::arg<int>(name_06,(int *)in_stack_fffffffffffff570);
  fmt::v5::basic_string_view<char>::basic_string_view
            ((basic_string_view<char> *)in_stack_fffffffffffff560,in_stack_fffffffffffff558);
  local_4cc = 0x2a;
  name_07.data_._4_4_ = in_stack_fffffffffffff57c;
  name_07.data_._0_4_ = in_stack_fffffffffffff578;
  name_07.size_ = (size_t)in_stack_fffffffffffff580;
  fmt::v5::arg<int>(name_07,(int *)in_stack_fffffffffffff570);
  fmt::v5::basic_string_view<char>::basic_string_view
            ((basic_string_view<char> *)in_stack_fffffffffffff560,in_stack_fffffffffffff558);
  local_51c = 0;
  name_08.data_._4_4_ = in_stack_fffffffffffff57c;
  name_08.data_._0_4_ = in_stack_fffffffffffff578;
  name_08.size_ = (size_t)in_stack_fffffffffffff580;
  fmt::v5::arg<int>(name_08,(int *)in_stack_fffffffffffff570);
  fmt::v5::basic_string_view<char>::basic_string_view
            ((basic_string_view<char> *)in_stack_fffffffffffff560,in_stack_fffffffffffff558);
  local_56c = 0;
  name_09.data_._4_4_ = in_stack_fffffffffffff57c;
  name_09.data_._0_4_ = in_stack_fffffffffffff578;
  name_09.size_ = (size_t)in_stack_fffffffffffff580;
  fmt::v5::arg<int>(name_09,(int *)in_stack_fffffffffffff570);
  fmt::v5::basic_string_view<char>::basic_string_view
            ((basic_string_view<char> *)in_stack_fffffffffffff560,in_stack_fffffffffffff558);
  local_5bc = 0;
  actual = &local_5a8;
  name_10.data_._4_4_ = in_stack_fffffffffffff57c;
  name_10.data_._0_4_ = in_stack_fffffffffffff578;
  name_10.size_ = (size_t)in_stack_fffffffffffff580;
  fmt::v5::arg<int>(name_10,(int *)in_stack_fffffffffffff570);
  fmt::v5::basic_string_view<char>::basic_string_view
            ((basic_string_view<char> *)in_stack_fffffffffffff560,in_stack_fffffffffffff558);
  local_60c = 0;
  expected = local_5f8;
  name_11.data_._4_4_ = in_stack_fffffffffffff57c;
  name_11.data_._0_4_ = in_stack_fffffffffffff578;
  name_11.size_ = (size_t)in_stack_fffffffffffff580;
  fmt::v5::arg<int>(name_11,(int *)in_stack_fffffffffffff570);
  fmt::v5::basic_string_view<char>::basic_string_view
            ((basic_string_view<char> *)in_stack_fffffffffffff560,in_stack_fffffffffffff558);
  local_65c = 0;
  actual_expression = local_648;
  name_12.data_._4_4_ = in_stack_fffffffffffff57c;
  name_12.data_._0_4_ = in_stack_fffffffffffff578;
  name_12.size_ = (size_t)in_stack_fffffffffffff580;
  fmt::v5::arg<int>(name_12,(int *)in_stack_fffffffffffff570);
  fmt::v5::basic_string_view<char>::basic_string_view
            ((basic_string_view<char> *)in_stack_fffffffffffff560,in_stack_fffffffffffff558);
  local_6ac = 0;
  expected_expression = local_698;
  name_13.data_._4_4_ = in_stack_fffffffffffff57c;
  name_13.data_._0_4_ = in_stack_fffffffffffff578;
  name_13.size_ = (size_t)in_stack_fffffffffffff580;
  fmt::v5::arg<int>(name_13,(int *)in_stack_fffffffffffff570);
  fmt::v5::basic_string_view<char>::basic_string_view
            ((basic_string_view<char> *)in_stack_fffffffffffff560,in_stack_fffffffffffff558);
  file = local_6e8;
  name_14.data_._4_4_ = in_stack_fffffffffffff57c;
  name_14.data_._0_4_ = in_stack_fffffffffffff578;
  name_14.size_ = (size_t)in_stack_fffffffffffff580;
  fmt::v5::arg<int>(name_14,(int *)in_stack_fffffffffffff570);
  fmt::v5::basic_string_view<char>::basic_string_view
            ((basic_string_view<char> *)in_stack_fffffffffffff560,in_stack_fffffffffffff558);
  uVar3 = 0;
  TVar2 = (Type)((ulong)&stack0xfffffffffffff8c8 >> 0x20);
  name_15.data_._4_4_ = in_stack_fffffffffffff57c;
  name_15.data_._0_4_ = in_stack_fffffffffffff578;
  name_15.size_ = (size_t)in_stack_fffffffffffff580;
  fmt::v5::arg<int>(name_15,(int *)in_stack_fffffffffffff570);
  fmt::v5::basic_string_view<char>::basic_string_view
            ((basic_string_view<char> *)in_stack_fffffffffffff560,in_stack_fffffffffffff558);
  this_00 = local_788;
  name_16.data_._4_4_ = in_stack_fffffffffffff57c;
  name_16.data_._0_4_ = in_stack_fffffffffffff578;
  name_16.size_ = (size_t)in_stack_fffffffffffff580;
  fmt::v5::arg<int>(name_16,(int *)in_stack_fffffffffffff570);
  fmt::v5::basic_string_view<char>::basic_string_view
            ((basic_string_view<char> *)in_stack_fffffffffffff560,in_stack_fffffffffffff558);
  name_17.data_._4_4_ = in_stack_fffffffffffff57c;
  name_17.data_._0_4_ = in_stack_fffffffffffff578;
  name_17.size_ = (size_t)in_stack_fffffffffffff580;
  fmt::v5::arg<int>(name_17,(int *)in_stack_fffffffffffff570);
  fmt::v5::basic_string_view<char>::basic_string_view
            ((basic_string_view<char> *)in_stack_fffffffffffff560,in_stack_fffffffffffff558);
  name_18.data_._4_4_ = in_stack_fffffffffffff57c;
  name_18.data_._0_4_ = in_stack_fffffffffffff578;
  name_18.size_ = (size_t)in_stack_fffffffffffff580;
  fmt::v5::arg<int>(name_18,(int *)in_stack_fffffffffffff570);
  fmt::v5::basic_string_view<char>::basic_string_view
            ((basic_string_view<char> *)in_stack_fffffffffffff560,in_stack_fffffffffffff558);
  name_19.data_._4_4_ = in_stack_fffffffffffff57c;
  name_19.data_._0_4_ = in_stack_fffffffffffff578;
  name_19.size_ = (size_t)in_stack_fffffffffffff580;
  fmt::v5::arg<int>(name_19,(int *)in_stack_fffffffffffff570);
  fmt::v5::basic_string_view<char>::basic_string_view
            ((basic_string_view<char> *)in_stack_fffffffffffff560,in_stack_fffffffffffff558);
  name_20.data_._4_4_ = in_stack_fffffffffffff57c;
  name_20.data_._0_4_ = in_stack_fffffffffffff578;
  name_20.size_ = (size_t)in_stack_fffffffffffff580;
  fmt::v5::arg<int>(name_20,(int *)in_stack_fffffffffffff570);
  message = actual_expression;
  this_01 = expected;
  fmt::v5::
  format<char[4],fmt::v5::internal::named_arg<int,char>,fmt::v5::internal::named_arg<int,char>,fmt::v5::internal::named_arg<int,char>,fmt::v5::internal::named_arg<int,char>,fmt::v5::internal::named_arg<int,char>,fmt::v5::internal::named_arg<int,char>,fmt::v5::internal::named_arg<int,char>,fmt::v5::internal::named_arg<int,char>,fmt::v5::internal::named_arg<int,char>,fmt::v5::internal::named_arg<int,char>,fmt::v5::internal::named_arg<int,char>,fmt::v5::internal::named_arg<int,char>,fmt::v5::internal::named_arg<int,char>,fmt::v5::internal::named_arg<int,char>,fmt::v5::internal::named_arg<int,char>,fmt::v5::internal::named_arg<int,char>>
            (in_stack_fffffffffffff848,in_stack_fffffffffffff840,in_stack_fffffffffffff838,
             in_stack_fffffffffffff830,in_stack_fffffffffffff828,in_stack_fffffffffffff890,
             in_stack_fffffffffffff898,in_stack_fffffffffffff8a0,in_stack_fffffffffffff8a8,
             (named_arg<int,_char> *)CONCAT44(uVar3,in_stack_fffffffffffff8b0),
             in_stack_fffffffffffff8b8,in_stack_fffffffffffff8c0,in_stack_fffffffffffff8c8,
             in_stack_fffffffffffff8d0,in_stack_fffffffffffff8d8,in_stack_fffffffffffff8e0,
             in_stack_fffffffffffff8e8);
  testing::internal::EqHelper<false>::Compare<char[3],std::__cxx11::string>
            (expected_expression,(char *)actual_expression,(char (*) [3])expected,actual);
  std::__cxx11::string::~string(local_3e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_3c0);
  if (!bVar1) {
    testing::Message::Message((Message *)this_00);
    testing::AssertionResult::failure_message((AssertionResult *)0x134625);
    testing::internal::AssertHelper::AssertHelper
              (this_00,TVar2,file,(int)((ulong)expected_expression >> 0x20),
               (char *)actual_expression);
    testing::internal::AssertHelper::operator=(this_01,message);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)actual);
    testing::Message::~Message((Message *)0x134682);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1346d7);
  return;
}

Assistant:

TEST(FormatterTest, NamedArg) {
  EXPECT_EQ("1/a/A", format("{_1}/{a_}/{A_}", fmt::arg("a_", 'a'),
                            fmt::arg("A_", "A"), fmt::arg("_1", 1)));
  EXPECT_THROW_MSG(format("{a}"), format_error, "argument not found");
  EXPECT_EQ(" -42", format("{0:{width}}", -42, fmt::arg("width", 4)));
  EXPECT_EQ("st", format("{0:.{precision}}", "str", fmt::arg("precision", 2)));
  EXPECT_EQ("1 2", format("{} {two}", 1, fmt::arg("two", 2)));
  EXPECT_EQ("42", format("{c}",
        fmt::arg("a", 0), fmt::arg("b", 0), fmt::arg("c", 42), fmt::arg("d", 0),
        fmt::arg("e", 0), fmt::arg("f", 0), fmt::arg("g", 0), fmt::arg("h", 0),
        fmt::arg("i", 0), fmt::arg("j", 0), fmt::arg("k", 0), fmt::arg("l", 0),
        fmt::arg("m", 0), fmt::arg("n", 0), fmt::arg("o", 0), fmt::arg("p", 0)));
}